

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_hlsl.cpp
# Opt level: O3

void __thiscall
spirv_cross::CompilerHLSL::emit_specialization_constants_and_structs(CompilerHLSL *this)

{
  uint uVar1;
  Types TVar2;
  TypedID<(spirv_cross::Types)0> *pTVar3;
  Variant *pVVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  uint32_t id;
  SPIRVariable *var;
  SPIRType *pSVar8;
  SPIRConstant *pSVar9;
  SPIRUndef *pSVar10;
  size_type sVar11;
  SPIRConstantOp *pSVar12;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar13;
  _Alloc_hider _Var14;
  string *ts_1;
  long lVar15;
  size_t sVar16;
  LoopLock loop_lock_1;
  string name;
  LoopLock loop_lock;
  SpecializationConstant wg_z;
  SpecializationConstant wg_y;
  SpecializationConstant wg_x;
  unordered_set<spirv_cross::TypedID<(spirv_cross::Types)1>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)1>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)1>_>,_std::allocator<spirv_cross::TypedID<(spirv_cross::Types)1>_>_>
  io_block_types;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  string local_e8;
  uint32_t local_c4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  ParsedIR *local_a0;
  LoopLock local_98;
  ulong local_90;
  TypedID<(spirv_cross::Types)0> *local_88;
  SpecializationConstant local_80;
  SpecializationConstant local_78;
  SpecializationConstant local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined4 local_48;
  undefined8 local_40;
  undefined8 uStack_38;
  
  local_70.id.id = 0;
  local_78.id.id = 0;
  local_80.id.id = 0;
  local_c4 = Compiler::get_work_group_size_specialization_constants
                       ((Compiler *)this,&local_70,&local_78,&local_80);
  local_68._M_allocated_capacity = (size_type)&uStack_38;
  local_68._8_8_ = 1;
  local_58 = 0;
  uStack_50 = 0;
  local_48 = 0x3f800000;
  local_40 = 0;
  uStack_38 = 0;
  local_a0 = &(this->super_CompilerGLSL).super_Compiler.ir;
  ParsedIR::create_loop_hard_lock(local_a0);
  sVar16 = (this->super_CompilerGLSL).super_Compiler.ir.ids_for_type[2].
           super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size;
  if (sVar16 != 0) {
    pTVar3 = (this->super_CompilerGLSL).super_Compiler.ir.ids_for_type[2].
             super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr;
    lVar15 = 0;
    do {
      uVar1 = *(uint *)((long)&pTVar3->id + lVar15);
      pVVar4 = (this->super_CompilerGLSL).super_Compiler.ir.ids.
               super_VectorView<spirv_cross::Variant>.ptr;
      if (pVVar4[uVar1].type == TypeVariable) {
        var = Variant::get<spirv_cross::SPIRVariable>(pVVar4 + uVar1);
        pSVar8 = Variant::get<spirv_cross::SPIRType>
                           ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                            super_VectorView<spirv_cross::Variant>.ptr +
                            *(uint *)&(var->super_IVariant).field_0xc);
        if (((((var->storage | StorageClassUniform) == StorageClassOutput) &&
             (var->remapped_variable == false)) && (pSVar8->pointer == true)) &&
           (((bVar5 = Compiler::is_builtin_variable((Compiler *)this,var), !bVar5 &&
             (bVar5 = Compiler::interface_variable_exists_in_entry_point
                                ((Compiler *)this,(var->super_IVariant).self.id), bVar5)) &&
            (bVar5 = Compiler::has_decoration
                               ((Compiler *)this,(ID)(pSVar8->super_IVariant).self.id,
                                DecorationBlock), bVar5)))) {
          local_c0._M_dataplus._M_p._0_4_ = (pSVar8->super_IVariant).self.id;
          local_e8._M_dataplus._M_p = (pointer)&local_68;
          ::std::
          _Hashtable<spirv_cross::TypedID<(spirv_cross::Types)1>,spirv_cross::TypedID<(spirv_cross::Types)1>,std::allocator<spirv_cross::TypedID<(spirv_cross::Types)1>>,std::__detail::_Identity,std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)1>>,std::hash<spirv_cross::TypedID<(spirv_cross::Types)1>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
          ::
          _M_insert<spirv_cross::TypedID<(spirv_cross::Types)1>,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<spirv_cross::TypedID<(spirv_cross::Types)1>,true>>>>
                    ((_Hashtable<spirv_cross::TypedID<(spirv_cross::Types)1>,spirv_cross::TypedID<(spirv_cross::Types)1>,std::allocator<spirv_cross::TypedID<(spirv_cross::Types)1>>,std::__detail::_Identity,std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)1>>,std::hash<spirv_cross::TypedID<(spirv_cross::Types)1>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                      *)local_e8._M_dataplus._M_p,&local_c0,&local_e8);
        }
      }
      lVar15 = lVar15 + 4;
    } while (sVar16 << 2 != lVar15);
  }
  ParsedIR::LoopLock::~LoopLock((LoopLock *)&local_108);
  ParsedIR::create_loop_hard_lock(local_a0);
  local_a0 = (ParsedIR *)
             (this->super_CompilerGLSL).super_Compiler.ir.ids_for_constant_undef_or_type.
             super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size;
  if (local_a0 != (ParsedIR *)0x0) {
    local_88 = (this->super_CompilerGLSL).super_Compiler.ir.ids_for_constant_undef_or_type.
               super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr;
    local_90 = (ulong)local_c4;
    local_a0 = (ParsedIR *)((long)local_a0 << 2);
    sVar16 = 0;
    bVar5 = false;
    do {
      pbVar13 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                (this->super_CompilerGLSL).super_Compiler.ir.ids.
                super_VectorView<spirv_cross::Variant>.ptr;
      pVVar4 = (Variant *)
               (&pbVar13->_M_dataplus + (ulong)*(uint *)((long)&local_88->id + sVar16) * 3);
      TVar2 = pVVar4->type;
      if (8 < (int)TVar2) {
        if (TVar2 == TypeConstantOp) {
          pSVar12 = Variant::get<spirv_cross::SPIRConstantOp>(pVVar4);
          pSVar8 = Variant::get<spirv_cross::SPIRType>
                             ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                              super_VectorView<spirv_cross::Variant>.ptr + (pSVar12->basetype).id);
          CompilerGLSL::add_resource_name
                    (&this->super_CompilerGLSL,(pSVar12->super_IVariant).self.id);
          (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                    (&local_e8,this,(ulong)(pSVar12->super_IVariant).self.id,1);
          (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x1b])
                    (&local_108,this,pSVar8,&local_e8,0);
          (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x18])(&local_c0,this,pSVar12);
          CompilerGLSL::
          statement<char_const(&)[14],std::__cxx11::string,char_const(&)[4],std::__cxx11::string,char_const(&)[2]>
                    (&this->super_CompilerGLSL,(char (*) [14])"static const ",&local_108,
                     (char (*) [4])0x2d3d47,&local_c0,(char (*) [2])0x2d3bdb);
LAB_001aa14d:
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT44(local_c0._M_dataplus._M_p._4_4_,(uint32_t)local_c0._M_dataplus._M_p) !=
              &local_c0.field_2) {
            operator_delete((undefined1 *)
                            CONCAT44(local_c0._M_dataplus._M_p._4_4_,
                                     (uint32_t)local_c0._M_dataplus._M_p));
          }
          pbVar13 = &local_108;
          _Var14._M_p = local_108._M_dataplus._M_p;
        }
        else {
          if (TVar2 != TypeUndef) goto LAB_001aa356;
          pSVar10 = Variant::get<spirv_cross::SPIRUndef>(pVVar4);
          pSVar8 = Variant::get<spirv_cross::SPIRType>
                             ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                              super_VectorView<spirv_cross::Variant>.ptr +
                              *(uint *)&(pSVar10->super_IVariant).field_0xc);
          if (pSVar8->basetype == Void) goto LAB_001aa3d9;
          local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
          local_e8._M_string_length = 0;
          local_e8.field_2._M_local_buf[0] = '\0';
          if (((this->super_CompilerGLSL).options.force_zero_initialized_variables == true) &&
             (bVar5 = CompilerGLSL::type_can_zero_initialize(&this->super_CompilerGLSL,pSVar8),
             bVar5)) {
            (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x3b])
                      (&local_c0,this,(ulong)*(uint *)&(pSVar10->super_IVariant).field_0xc);
            join<char_const(&)[4],std::__cxx11::string>
                      (&local_108,(spirv_cross *)0x2d3d47,(char (*) [4])&local_c0,pbVar13);
            ::std::__cxx11::string::operator=((string *)&local_e8,(string *)&local_108);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_108._M_dataplus._M_p != &local_108.field_2) {
              operator_delete(local_108._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)CONCAT44(local_c0._M_dataplus._M_p._4_4_,(uint32_t)local_c0._M_dataplus._M_p) !=
                &local_c0.field_2) {
              operator_delete((undefined1 *)
                              CONCAT44(local_c0._M_dataplus._M_p._4_4_,
                                       (uint32_t)local_c0._M_dataplus._M_p));
            }
          }
          (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                    (&local_c0,this,(ulong)(pSVar10->super_IVariant).self.id,1);
          (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x1b])
                    (&local_108,this,pSVar8,&local_c0,(ulong)(pSVar10->super_IVariant).self.id);
          CompilerGLSL::
          statement<char_const(&)[8],std::__cxx11::string,std::__cxx11::string&,char_const(&)[2]>
                    (&this->super_CompilerGLSL,(char (*) [8])"static ",&local_108,&local_e8,
                     (char (*) [2])0x2d3bdb);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_108._M_dataplus._M_p != &local_108.field_2) {
            operator_delete(local_108._M_dataplus._M_p);
          }
          _Var14._M_p = (pointer)CONCAT44(local_c0._M_dataplus._M_p._4_4_,
                                          (uint32_t)local_c0._M_dataplus._M_p);
          pbVar13 = &local_c0;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var14._M_p != &pbVar13->field_2) {
          operator_delete(_Var14._M_p);
        }
        goto LAB_001aa174;
      }
      if (TVar2 == TypeType) {
        pSVar8 = Variant::get<spirv_cross::SPIRType>(pVVar4);
        bVar6 = Compiler::has_decoration
                          ((Compiler *)this,(ID)(pSVar8->super_IVariant).self.id,DecorationBlock);
        if (bVar6) {
          local_e8._M_dataplus._M_p._0_4_ = (pSVar8->super_IVariant).self.id;
          sVar11 = ::std::
                   _Hashtable<spirv_cross::TypedID<(spirv_cross::Types)1>,_spirv_cross::TypedID<(spirv_cross::Types)1>,_std::allocator<spirv_cross::TypedID<(spirv_cross::Types)1>_>,_std::__detail::_Identity,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)1>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)1>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                   ::count((_Hashtable<spirv_cross::TypedID<(spirv_cross::Types)1>,_spirv_cross::TypedID<(spirv_cross::Types)1>,_std::allocator<spirv_cross::TypedID<(spirv_cross::Types)1>_>,_std::__detail::_Identity,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)1>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)1>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                            *)&local_68,(key_type *)&local_e8);
          bVar6 = sVar11 == 0;
        }
        else {
          bVar6 = false;
        }
        bVar7 = Compiler::has_decoration
                          ((Compiler *)this,(ID)(pSVar8->super_IVariant).self.id,
                           DecorationBufferBlock);
        if (((pSVar8->basetype == Struct) &&
            ((pSVar8->array).super_VectorView<unsigned_int>.buffer_size == 0)) &&
           (!bVar7 && (!bVar6 && pSVar8->pointer == false))) {
          if (bVar5) {
            CompilerGLSL::statement<char_const(&)[1]>
                      (&this->super_CompilerGLSL,(char (*) [1])0x2aec75);
          }
          CompilerGLSL::emit_struct(&this->super_CompilerGLSL,pSVar8);
          bVar5 = false;
        }
      }
      else if (TVar2 == TypeConstant) {
        pSVar9 = Variant::get<spirv_cross::SPIRConstant>(pVVar4);
        if ((pSVar9->super_IVariant).self.id == local_c4) {
          pSVar9 = Variant::get<spirv_cross::SPIRConstant>
                             ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                              super_VectorView<spirv_cross::Variant>.ptr + local_90);
          CompilerGLSL::constant_expression_abi_cxx11_
                    (&local_e8,&this->super_CompilerGLSL,pSVar9,false,false);
          CompilerGLSL::statement<char_const(&)[39],std::__cxx11::string,char_const(&)[2]>
                    (&this->super_CompilerGLSL,
                     (char (*) [39])"static const uint3 gl_WorkGroupSize = ",&local_e8,
                     (char (*) [2])0x2d3bdb);
        }
        else {
          if (pSVar9->specialization != true) goto LAB_001aa356;
          pSVar8 = Variant::get<spirv_cross::SPIRType>
                             ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                              super_VectorView<spirv_cross::Variant>.ptr +
                              *(uint *)&(pSVar9->super_IVariant).field_0xc);
          CompilerGLSL::add_resource_name
                    (&this->super_CompilerGLSL,(pSVar9->super_IVariant).self.id);
          (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                    (&local_e8,this,(ulong)(pSVar9->super_IVariant).self.id);
          bVar5 = Compiler::has_decoration
                            ((Compiler *)this,(ID)(pSVar9->super_IVariant).self.id,DecorationSpecId)
          ;
          if (!bVar5) {
            (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x1b])
                      (&local_108,this,pSVar8);
            CompilerGLSL::constant_expression_abi_cxx11_
                      (&local_c0,&this->super_CompilerGLSL,pSVar9,false,false);
            CompilerGLSL::
            statement<char_const(&)[14],std::__cxx11::string,char_const(&)[4],std::__cxx11::string,char_const(&)[2]>
                      (&this->super_CompilerGLSL,(char (*) [14])"static const ",&local_108,
                       (char (*) [4])0x2d3d47,&local_c0,(char (*) [2])0x2d3bdb);
            goto LAB_001aa14d;
          }
          id = Compiler::get_decoration
                         ((Compiler *)this,(ID)(pSVar9->super_IVariant).self.id,DecorationSpecId);
          CompilerGLSL::constant_value_macro_name_abi_cxx11_
                    (&local_108,&this->super_CompilerGLSL,id);
          ts_1 = &pSVar9->specialization_constant_macro_name;
          ::std::__cxx11::string::operator=((string *)ts_1,(string *)&local_108);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_108._M_dataplus._M_p != &local_108.field_2) {
            operator_delete(local_108._M_dataplus._M_p);
          }
          CompilerGLSL::statement<char_const(&)[9],std::__cxx11::string&>
                    (&this->super_CompilerGLSL,(char (*) [9])"#ifndef ",ts_1);
          CompilerGLSL::constant_expression_abi_cxx11_
                    (&local_108,&this->super_CompilerGLSL,pSVar9,false,false);
          CompilerGLSL::
          statement<char_const(&)[9],std::__cxx11::string&,char_const(&)[2],std::__cxx11::string>
                    (&this->super_CompilerGLSL,(char (*) [9])"#define ",ts_1,(char (*) [2])0x2bb1d1,
                     &local_108);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_108._M_dataplus._M_p != &local_108.field_2) {
            operator_delete(local_108._M_dataplus._M_p);
          }
          CompilerGLSL::statement<char_const(&)[7]>
                    (&this->super_CompilerGLSL,(char (*) [7])"#endif");
          (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x1b])
                    (&local_108,this,pSVar8,&local_e8,0);
          CompilerGLSL::
          statement<char_const(&)[14],std::__cxx11::string,char_const(&)[4],std::__cxx11::string&,char_const(&)[2]>
                    (&this->super_CompilerGLSL,(char (*) [14])"static const ",&local_108,
                     (char (*) [4])0x2d3d47,ts_1,(char (*) [2])0x2d3bdb);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_108._M_dataplus._M_p != &local_108.field_2) {
            operator_delete(local_108._M_dataplus._M_p);
          }
        }
LAB_001aa174:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
          operator_delete(local_e8._M_dataplus._M_p);
        }
        bVar5 = true;
      }
LAB_001aa356:
      sVar16 = sVar16 + 4;
    } while (local_a0 != (ParsedIR *)sVar16);
    if (bVar5) {
      CompilerGLSL::statement<char_const(&)[1]>(&this->super_CompilerGLSL,(char (*) [1])0x2aec75);
    }
  }
LAB_001aa3d9:
  ParsedIR::LoopLock::~LoopLock(&local_98);
  ::std::
  _Hashtable<spirv_cross::TypedID<(spirv_cross::Types)1>,_spirv_cross::TypedID<(spirv_cross::Types)1>,_std::allocator<spirv_cross::TypedID<(spirv_cross::Types)1>_>,_std::__detail::_Identity,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)1>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)1>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable((_Hashtable<spirv_cross::TypedID<(spirv_cross::Types)1>,_spirv_cross::TypedID<(spirv_cross::Types)1>,_std::allocator<spirv_cross::TypedID<(spirv_cross::Types)1>_>,_std::__detail::_Identity,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)1>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)1>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                 *)&local_68);
  return;
}

Assistant:

void CompilerHLSL::emit_specialization_constants_and_structs()
{
	bool emitted = false;
	SpecializationConstant wg_x, wg_y, wg_z;
	ID workgroup_size_id = get_work_group_size_specialization_constants(wg_x, wg_y, wg_z);

	std::unordered_set<TypeID> io_block_types;
	ir.for_each_typed_id<SPIRVariable>([&](uint32_t, const SPIRVariable &var) {
		auto &type = this->get<SPIRType>(var.basetype);
		if ((var.storage == StorageClassInput || var.storage == StorageClassOutput) &&
		    !var.remapped_variable && type.pointer && !is_builtin_variable(var) &&
		    interface_variable_exists_in_entry_point(var.self) &&
		    has_decoration(type.self, DecorationBlock))
		{
			io_block_types.insert(type.self);
		}
	});

	auto loop_lock = ir.create_loop_hard_lock();
	for (auto &id_ : ir.ids_for_constant_undef_or_type)
	{
		auto &id = ir.ids[id_];

		if (id.get_type() == TypeConstant)
		{
			auto &c = id.get<SPIRConstant>();

			if (c.self == workgroup_size_id)
			{
				statement("static const uint3 gl_WorkGroupSize = ",
				          constant_expression(get<SPIRConstant>(workgroup_size_id)), ";");
				emitted = true;
			}
			else if (c.specialization)
			{
				auto &type = get<SPIRType>(c.constant_type);
				add_resource_name(c.self);
				auto name = to_name(c.self);

				if (has_decoration(c.self, DecorationSpecId))
				{
					// HLSL does not support specialization constants, so fallback to macros.
					c.specialization_constant_macro_name =
							constant_value_macro_name(get_decoration(c.self, DecorationSpecId));

					statement("#ifndef ", c.specialization_constant_macro_name);
					statement("#define ", c.specialization_constant_macro_name, " ", constant_expression(c));
					statement("#endif");
					statement("static const ", variable_decl(type, name), " = ", c.specialization_constant_macro_name, ";");
				}
				else
					statement("static const ", variable_decl(type, name), " = ", constant_expression(c), ";");

				emitted = true;
			}
		}
		else if (id.get_type() == TypeConstantOp)
		{
			auto &c = id.get<SPIRConstantOp>();
			auto &type = get<SPIRType>(c.basetype);
			add_resource_name(c.self);
			auto name = to_name(c.self);
			statement("static const ", variable_decl(type, name), " = ", constant_op_expression(c), ";");
			emitted = true;
		}
		else if (id.get_type() == TypeType)
		{
			auto &type = id.get<SPIRType>();
			bool is_non_io_block = has_decoration(type.self, DecorationBlock) &&
			                       io_block_types.count(type.self) == 0;
			bool is_buffer_block = has_decoration(type.self, DecorationBufferBlock);
			if (type.basetype == SPIRType::Struct && type.array.empty() &&
			    !type.pointer && !is_non_io_block && !is_buffer_block)
			{
				if (emitted)
					statement("");
				emitted = false;

				emit_struct(type);
			}
		}
		else if (id.get_type() == TypeUndef)
		{
			auto &undef = id.get<SPIRUndef>();
			auto &type = this->get<SPIRType>(undef.basetype);
			// OpUndef can be void for some reason ...
			if (type.basetype == SPIRType::Void)
				return;

			string initializer;
			if (options.force_zero_initialized_variables && type_can_zero_initialize(type))
				initializer = join(" = ", to_zero_initialized_expression(undef.basetype));

			statement("static ", variable_decl(type, to_name(undef.self), undef.self), initializer, ";");
			emitted = true;
		}
	}

	if (emitted)
		statement("");
}